

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argagg.hpp
# Opt level: O2

string * argagg::construct_line(string *__return_storage_ptr__,string *indent,string *contents)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  string local_38;
  
  rstrip(&local_38,contents);
  std::operator+(&bStack_58,indent,&local_38);
  std::operator+(__return_storage_ptr__,&bStack_58,"\n");
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

inline
std::string construct_line(const std::string& indent,
                           const std::string& contents)
{
  return indent + rstrip(contents) + "\n";
}